

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::Options::OutputOptionParser::parseIntoConfig
          (OutputOptionParser *this,Command *cmd,ConfigData *config)

{
  char cVar1;
  char *pcVar2;
  string local_b0;
  string local_90;
  string local_70 [48];
  string local_40;
  ConfigData *local_20;
  ConfigData *config_local;
  Command *cmd_local;
  OutputOptionParser *this_local;
  
  local_20 = config;
  config_local = (ConfigData *)cmd;
  cmd_local = (Command *)this;
  Command::operator[][abi_cxx11_(&local_40,cmd,0);
  pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)&local_40);
  cVar1 = *pcVar2;
  std::__cxx11::string::~string((string *)&local_40);
  if (cVar1 == '%') {
    Command::operator[][abi_cxx11_(&local_90,(Command *)config_local,0);
    std::__cxx11::string::substr((ulong)local_70,(ulong)&local_90);
    std::__cxx11::string::operator=((string *)&local_20->stream,local_70);
    std::__cxx11::string::~string(local_70);
    std::__cxx11::string::~string((string *)&local_90);
  }
  else {
    Command::operator[][abi_cxx11_(&local_b0,(Command *)config_local,0);
    std::__cxx11::string::operator=((string *)&local_20->outputFilename,(string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_b0);
  }
  return;
}

Assistant:

virtual void parseIntoConfig( const Command& cmd, ConfigData& config ) {
                if( cmd[0][0] == '%' )
                    config.stream = cmd[0].substr( 1 );
                else
                    config.outputFilename = cmd[0];
            }